

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

bool __thiscall
despot::BaseTag::Step(BaseTag *this,State *s,double random_num,ACT_TYPE action,double *reward)

{
  int iVar1;
  int iVar2;
  ACT_TYPE AVar3;
  const_reference pvVar4;
  const_reference this_00;
  const_reference this_01;
  size_type sVar5;
  const_reference pvVar6;
  State *next;
  double dStack_50;
  int i;
  double sum;
  vector<despot::State,_std::allocator<despot::State>_> *distribution;
  bool terminal;
  TagState *state;
  double *reward_local;
  ACT_TYPE action_local;
  double random_num_local;
  State *s_local;
  BaseTag *this_local;
  
  distribution._7_1_ = false;
  AVar3 = TagAction(this);
  if (action == AVar3) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->rob_,(long)*(int *)(s + 0xc))
    ;
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)*(int *)(s + 0xc))
    ;
    iVar1 = *pvVar4;
    if (iVar2 != iVar1) {
      *reward = -TAG_REWARD;
    }
    else {
      *reward = TAG_REWARD;
    }
    distribution._7_1_ = iVar2 == iVar1;
  }
  else {
    *reward = -1.0;
  }
  this_00 = std::
            vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
            ::operator[](&this->transition_probabilities_,(long)*(int *)(s + 0xc));
  this_01 = std::
            vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
            ::operator[](this_00,(long)action);
  dStack_50 = 0.0;
  next._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<despot::State,_std::allocator<despot::State>_>::size(this_01);
    if (sVar5 <= (ulong)(long)next._4_4_) {
      return distribution._7_1_;
    }
    pvVar6 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                       (this_01,(long)next._4_4_);
    dStack_50 = *(double *)(pvVar6 + 0x18) + dStack_50;
    if (random_num <= dStack_50) break;
    next._4_4_ = next._4_4_ + 1;
  }
  *(undefined4 *)(s + 0xc) = *(undefined4 *)(pvVar6 + 0xc);
  return distribution._7_1_;
}

Assistant:

bool BaseTag::Step(State& s, double random_num, ACT_TYPE action,
	double& reward) const {
	TagState& state = static_cast<TagState&>(s);

	bool terminal = false;
	if (action == TagAction()) {
		if (rob_[state.state_id] == opp_[state.state_id]) {
			reward = TAG_REWARD;
			terminal = true;
		} else {
			reward = -TAG_REWARD;
		}
	} else {
		reward = -1;
	}

	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			state.state_id = next.state_id;
			break;
		}
	}

	return terminal;
}